

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  uint uVar1;
  int iStatCur;
  Table *pTVar2;
  Schema **ppSVar3;
  char *zWhereType;
  int iDb;
  ulong uVar4;
  Parse *pPVar5;
  
  if (pTab->pSchema == (Schema *)0x0) {
    uVar4 = 0xfff0bdc0;
  }
  else {
    uVar1 = pParse->db->nDb;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    else {
      ppSVar3 = &pParse->db->aDb->pSchema;
      uVar4 = 0;
      do {
        if (*ppSVar3 == pTab->pSchema) goto LAB_0017daf5;
        uVar4 = uVar4 + 1;
        ppSVar3 = ppSVar3 + 4;
      } while (uVar1 != uVar4);
      uVar4 = (ulong)uVar1;
    }
  }
LAB_0017daf5:
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  iDb = (int)uVar4;
  sqlite3CodeVerifySchema(pParse,iDb);
  pPVar5->writeMask = pPVar5->writeMask | 1 << ((byte)uVar4 & 0x1f);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  pTVar2 = (Table *)pOnlyIdx;
  if (pOnlyIdx == (Index *)0x0) {
    pTVar2 = pTab;
  }
  zWhereType = "idx";
  if (pOnlyIdx == (Index *)0x0) {
    zWhereType = "tbl";
  }
  openStatTable(pParse,iDb,iStatCur,pTVar2->zName,zWhereType);
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur,pParse->nMem + 1,pParse->nTab);
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}